

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void pybind11::class_<anurbs::Polyline<3L>,_std::shared_ptr<anurbs::Polyline<3L>_>_>::init_holder
               (instance *inst,value_and_holder *v_h,holder_type *holder_ptr,void *param_4)

{
  if (holder_ptr == (holder_type *)0x0) {
    if ((inst->field_0x30 & 1) == 0) {
      return;
    }
    std::__shared_ptr<anurbs::Polyline<3l>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<anurbs::Polyline<3l>,void>
              ((__shared_ptr<anurbs::Polyline<3l>,(__gnu_cxx::_Lock_policy)2> *)(v_h->vh + 1),
               (Polyline<3L> *)*v_h->vh);
  }
  else {
    init_holder_from_existing(v_h,holder_ptr);
  }
  detail::value_and_holder::set_holder_constructed(v_h,true);
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type *holder_ptr, const void * /* dummy -- not enable_shared_from_this<T>) */) {
        if (holder_ptr) {
            init_holder_from_existing(v_h, holder_ptr, std::is_copy_constructible<holder_type>());
            v_h.set_holder_constructed();
        } else if (inst->owned || detail::always_construct_holder<holder_type>::value) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }